

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1716::run(TestCase1716 *this)

{
  bool bVar1;
  MessageSize MVar2;
  Builder root;
  Builder local_148;
  Reader local_130;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&message.super_MessageBuilder);
  MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize(&root);
  if ((MVar2.wordCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_148.builder.segment = (SegmentBuilder *)CONCAT44(local_148.builder.segment._4_4_,1);
    MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize(&root);
    local_130._reader.segment = (SegmentReader *)MVar2.wordCount;
    local_130._reader.capTable._0_4_ = MVar2.capCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6b8,ERROR,
               "\"failed: expected \" \"(1) == (root.totalSize().wordCount)\", 1, root.totalSize().wordCount"
               ,(char (*) [53])"failed: expected (1) == (root.totalSize().wordCount)",
               (int *)&local_148,(unsigned_long *)&local_130);
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Reader::hasAnyPointerField(&local_130);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6ba,ERROR,"\"failed: expected \" \"!(root.asReader().hasAnyPointerField())\"",
               (char (*) [57])"failed: expected !(root.asReader().hasAnyPointerField())");
  }
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Builder::hasAnyPointerField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6bb,ERROR,"\"failed: expected \" \"!(root.hasAnyPointerField())\"",
               (char (*) [46])"failed: expected !(root.hasAnyPointerField())");
  }
  local_148.builder.segment = root._builder.segment;
  local_148.builder.capTable = root._builder.capTable;
  local_148.builder.pointer = root._builder.pointers;
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestEmptyStruct>
            ((BuilderFor<capnproto_test::capnp::test::TestEmptyStruct> *)&local_130,&local_148);
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Reader::hasAnyPointerField(&local_130);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6bd,ERROR,"\"failed: expected \" \"root.asReader().hasAnyPointerField()\"",
               (char (*) [54])"failed: expected root.asReader().hasAnyPointerField()");
  }
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Builder::hasAnyPointerField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6be,ERROR,"\"failed: expected \" \"root.hasAnyPointerField()\"",
               (char (*) [43])"failed: expected root.hasAnyPointerField()");
  }
  MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize(&root);
  if ((MVar2.wordCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_148.builder.segment = (SegmentBuilder *)CONCAT44(local_148.builder.segment._4_4_,1);
    MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize(&root);
    local_130._reader.segment = (SegmentReader *)MVar2.wordCount;
    local_130._reader.capTable._0_4_ = MVar2.capCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6c0,ERROR,
               "\"failed: expected \" \"(1) == (root.totalSize().wordCount)\", 1, root.totalSize().wordCount"
               ,(char (*) [53])"failed: expected (1) == (root.totalSize().wordCount)",
               (int *)&local_148,(unsigned_long *)&local_130);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Encoding, HasEmptyStruct) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestAnyPointer>();

  EXPECT_EQ(1, root.totalSize().wordCount);

  EXPECT_FALSE(root.asReader().hasAnyPointerField());
  EXPECT_FALSE(root.hasAnyPointerField());
  root.getAnyPointerField().initAs<test::TestEmptyStruct>();
  EXPECT_TRUE(root.asReader().hasAnyPointerField());
  EXPECT_TRUE(root.hasAnyPointerField());

  EXPECT_EQ(1, root.totalSize().wordCount);
}